

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

void txpackage_tests::package_cpfp_tests_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_FS_OFFSET;
  package_cpfp_tests t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff178;
  std_string *in_stack_fffffffffffff180;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff188;
  const_string *in_stack_fffffffffffff1a0;
  size_t in_stack_fffffffffffff1a8;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff1b0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff1b8;
  undefined1 local_cb0 [408];
  undefined1 local_b18 [408];
  undefined1 local_980 [408];
  undefined1 local_7e8 [408];
  package_cpfp_tests local_650;
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  package_cpfp_tests::package_cpfp_tests((package_cpfp_tests *)in_stack_fffffffffffff178);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_7e8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [16])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::setup_conditional<txpackage_tests::package_cpfp_tests>
            ((package_cpfp_tests *)0xb778c0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_980,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [13])in_stack_fffffffffffff180);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  package_cpfp_tests::test_method(&local_650);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  memset(local_b18,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::unit_test::teardown_conditional<txpackage_tests::package_cpfp_tests>
            ((package_cpfp_tests *)0xb77aec);
  file = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff188,
             (pointer)in_stack_fffffffffffff180,(unsigned_long)in_stack_fffffffffffff178);
  __s = local_cb0;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff178);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff178);
  msg = boost::operator<<(in_stack_fffffffffffff188,(char *)in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [19])in_stack_fffffffffffff180);
  boost::operator<<(in_stack_fffffffffffff188,(char (*) [15])in_stack_fffffffffffff180);
  this_00 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff188);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this_00,in_stack_fffffffffffff180);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,file,(size_t)__s,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff178);
  package_cpfp_tests::~package_cpfp_tests((package_cpfp_tests *)in_stack_fffffffffffff178);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_cpfp_tests)
{
    mineBlocks(5);
    MockMempoolMinFee(CFeeRate(5000));
    LOCK(::cs_main);
    size_t expected_pool_size = m_node.mempool->size();
    CKey child_key = GenerateRandomKey();
    CScript parent_spk = GetScriptForDestination(WitnessV0KeyHash(child_key.GetPubKey()));
    CKey grandchild_key = GenerateRandomKey();
    CScript child_spk = GetScriptForDestination(WitnessV0KeyHash(grandchild_key.GetPubKey()));

    // low-fee parent and high-fee child package
    const CAmount coinbase_value{50 * COIN};
    const CAmount parent_value{coinbase_value - low_fee_amt};
    const CAmount child_value{parent_value - COIN};

    Package package_cpfp;
    auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                    /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                    /*output_destination=*/parent_spk,
                                                    /*output_amount=*/parent_value, /*submit=*/false);
    CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);
    package_cpfp.push_back(tx_parent);

    auto mtx_child = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent, /*input_vout=*/0,
                                                   /*input_height=*/101, /*input_signing_key=*/child_key,
                                                   /*output_destination=*/child_spk,
                                                   /*output_amount=*/child_value, /*submit=*/false);
    CTransactionRef tx_child = MakeTransactionRef(mtx_child);
    package_cpfp.push_back(tx_child);

    // Package feerate is calculated using modified fees, and prioritisetransaction accepts negative
    // fee deltas. This should be taken into account. De-prioritise the parent transaction
    // to bring the package feerate to 0.
    m_node.mempool->PrioritiseTransaction(tx_parent->GetHash(), child_value - coinbase_value);
    {
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        const auto submit_cpfp_deprio = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_cpfp, /*test_accept=*/ false, /*client_maxfeerate=*/{});
        if (auto err_cpfp_deprio{CheckPackageMempoolAcceptResult(package_cpfp, submit_cpfp_deprio, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_cpfp_deprio.value());
        } else {
            BOOST_CHECK_EQUAL(submit_cpfp_deprio.m_state.GetResult(), PackageValidationResult::PCKG_TX);
            BOOST_CHECK_EQUAL(submit_cpfp_deprio.m_tx_results.find(tx_parent->GetWitnessHash())->second.m_state.GetResult(),
                              TxValidationResult::TX_MEMPOOL_POLICY);
            BOOST_CHECK_EQUAL(submit_cpfp_deprio.m_tx_results.find(tx_child->GetWitnessHash())->second.m_state.GetResult(),
                              TxValidationResult::TX_MISSING_INPUTS);
            BOOST_CHECK(submit_cpfp_deprio.m_tx_results.find(tx_parent->GetWitnessHash())->second.m_state.GetRejectReason() == "min relay fee not met");
            BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        }
    }

    // Clear the prioritisation of the parent transaction.
    WITH_LOCK(m_node.mempool->cs, m_node.mempool->ClearPrioritisation(tx_parent->GetHash()));

    // Package CPFP: Even though the parent's feerate is below the mempool minimum feerate, the
    // child pays enough for the package feerate to meet the threshold.
    {
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        const auto submit_cpfp = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_cpfp, /*test_accept=*/ false, /*client_maxfeerate=*/{});
        if (auto err_cpfp{CheckPackageMempoolAcceptResult(package_cpfp, submit_cpfp, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_cpfp.value());
        } else {
            auto it_parent = submit_cpfp.m_tx_results.find(tx_parent->GetWitnessHash());
            auto it_child = submit_cpfp.m_tx_results.find(tx_child->GetWitnessHash());
            BOOST_CHECK(it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_parent->second.m_base_fees.value() == coinbase_value - parent_value);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_base_fees.value() == COIN);

            const CFeeRate expected_feerate(coinbase_value - child_value,
                                            GetVirtualTransactionSize(*tx_parent) + GetVirtualTransactionSize(*tx_child));
            BOOST_CHECK(it_parent->second.m_effective_feerate.value() == expected_feerate);
            BOOST_CHECK(it_child->second.m_effective_feerate.value() == expected_feerate);
            std::vector<Wtxid> expected_wtxids({tx_parent->GetWitnessHash(), tx_child->GetWitnessHash()});
            BOOST_CHECK(it_parent->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(expected_feerate.GetFeePerK() > 1000);
        }
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Just because we allow low-fee parents doesn't mean we allow low-feerate packages.
    // The mempool minimum feerate is 5sat/vB, but this package just pays 800 satoshis total.
    // The child fees would be able to pay for itself, but isn't enough for the entire package.
    Package package_still_too_low;
    const CAmount parent_fee{200};
    const CAmount child_fee{600};
    auto mtx_parent_cheap = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[1], /*input_vout=*/0,
                                                          /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                          /*output_destination=*/parent_spk,
                                                          /*output_amount=*/coinbase_value - parent_fee, /*submit=*/false);
    CTransactionRef tx_parent_cheap = MakeTransactionRef(mtx_parent_cheap);
    package_still_too_low.push_back(tx_parent_cheap);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*tx_parent_cheap)) > parent_fee);
    BOOST_CHECK(m_node.mempool->m_opts.min_relay_feerate.GetFee(GetVirtualTransactionSize(*tx_parent_cheap)) <= parent_fee);

    auto mtx_child_cheap = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent_cheap, /*input_vout=*/0,
                                                         /*input_height=*/101, /*input_signing_key=*/child_key,
                                                         /*output_destination=*/child_spk,
                                                         /*output_amount=*/coinbase_value - parent_fee - child_fee, /*submit=*/false);
    CTransactionRef tx_child_cheap = MakeTransactionRef(mtx_child_cheap);
    package_still_too_low.push_back(tx_child_cheap);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*tx_child_cheap)) <= child_fee);
    BOOST_CHECK(m_node.mempool->GetMinFee().GetFee(GetVirtualTransactionSize(*tx_parent_cheap) + GetVirtualTransactionSize(*tx_child_cheap)) > parent_fee + child_fee);
    BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

    // Cheap package should fail for being too low fee.
    {
        const auto submit_package_too_low = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                   package_still_too_low, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_package_too_low{CheckPackageMempoolAcceptResult(package_still_too_low, submit_package_too_low, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_package_too_low.value());
        } else {
            // Individual feerate of parent is too low.
            BOOST_CHECK_EQUAL(submit_package_too_low.m_tx_results.at(tx_parent_cheap->GetWitnessHash()).m_state.GetResult(),
                              TxValidationResult::TX_RECONSIDERABLE);
            BOOST_CHECK(submit_package_too_low.m_tx_results.at(tx_parent_cheap->GetWitnessHash()).m_effective_feerate.value() ==
                        CFeeRate(parent_fee, GetVirtualTransactionSize(*tx_parent_cheap)));
            // Package feerate of parent + child is too low.
            BOOST_CHECK_EQUAL(submit_package_too_low.m_tx_results.at(tx_child_cheap->GetWitnessHash()).m_state.GetResult(),
                              TxValidationResult::TX_RECONSIDERABLE);
            BOOST_CHECK(submit_package_too_low.m_tx_results.at(tx_child_cheap->GetWitnessHash()).m_effective_feerate.value() ==
                        CFeeRate(parent_fee + child_fee, GetVirtualTransactionSize(*tx_parent_cheap) + GetVirtualTransactionSize(*tx_child_cheap)));
        }
        BOOST_CHECK_EQUAL(submit_package_too_low.m_state.GetResult(), PackageValidationResult::PCKG_TX);
        BOOST_CHECK_EQUAL(submit_package_too_low.m_state.GetRejectReason(), "transaction failed");
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Package feerate includes the modified fees of the transactions.
    // This means a child with its fee delta from prioritisetransaction can pay for a parent.
    m_node.mempool->PrioritiseTransaction(tx_child_cheap->GetHash(), 1 * COIN);
    // Now that the child's fees have "increased" by 1 BTC, the cheap package should succeed.
    {
        const auto submit_prioritised_package = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                                  package_still_too_low, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_prioritised{CheckPackageMempoolAcceptResult(package_still_too_low, submit_prioritised_package, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_prioritised.value());
        } else {
            const CFeeRate expected_feerate(1 * COIN + parent_fee + child_fee,
                GetVirtualTransactionSize(*tx_parent_cheap) + GetVirtualTransactionSize(*tx_child_cheap));
            BOOST_CHECK_EQUAL(submit_prioritised_package.m_tx_results.size(), package_still_too_low.size());
            auto it_parent = submit_prioritised_package.m_tx_results.find(tx_parent_cheap->GetWitnessHash());
            auto it_child = submit_prioritised_package.m_tx_results.find(tx_child_cheap->GetWitnessHash());
            BOOST_CHECK(it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_parent->second.m_base_fees.value() == parent_fee);
            BOOST_CHECK(it_parent->second.m_effective_feerate.value() == expected_feerate);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_base_fees.value() == child_fee);
            BOOST_CHECK(it_child->second.m_effective_feerate.value() == expected_feerate);
            std::vector<Wtxid> expected_wtxids({tx_parent_cheap->GetWitnessHash(), tx_child_cheap->GetWitnessHash()});
            BOOST_CHECK(it_parent->second.m_wtxids_fee_calculations.value() == expected_wtxids);
            BOOST_CHECK(it_child->second.m_wtxids_fee_calculations.value() == expected_wtxids);
        }
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

    // Package feerate is calculated without topology in mind; it's just aggregating fees and sizes.
    // However, this should not allow parents to pay for children. Each transaction should be
    // validated individually first, eliminating sufficient-feerate parents before they are unfairly
    // included in the package feerate. It's also important that the low-fee child doesn't prevent
    // the parent from being accepted.
    Package package_rich_parent;
    const CAmount high_parent_fee{1 * COIN};
    auto mtx_parent_rich = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[2], /*input_vout=*/0,
                                                         /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                         /*output_destination=*/parent_spk,
                                                         /*output_amount=*/coinbase_value - high_parent_fee, /*submit=*/false);
    CTransactionRef tx_parent_rich = MakeTransactionRef(mtx_parent_rich);
    package_rich_parent.push_back(tx_parent_rich);

    auto mtx_child_poor = CreateValidMempoolTransaction(/*input_transaction=*/tx_parent_rich, /*input_vout=*/0,
                                                        /*input_height=*/101, /*input_signing_key=*/child_key,
                                                        /*output_destination=*/child_spk,
                                                        /*output_amount=*/coinbase_value - high_parent_fee, /*submit=*/false);
    CTransactionRef tx_child_poor = MakeTransactionRef(mtx_child_poor);
    package_rich_parent.push_back(tx_child_poor);

    // Parent pays 1 BTC and child pays none. The parent should be accepted without the child.
    {
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
        const auto submit_rich_parent = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool,
                                                          package_rich_parent, /*test_accept=*/false, /*client_maxfeerate=*/{});
        if (auto err_rich_parent{CheckPackageMempoolAcceptResult(package_rich_parent, submit_rich_parent, /*expect_valid=*/false, m_node.mempool.get())}) {
            BOOST_ERROR(err_rich_parent.value());
        } else {
            // The child would have been validated on its own and failed.
            BOOST_CHECK_EQUAL(submit_rich_parent.m_state.GetResult(), PackageValidationResult::PCKG_TX);
            BOOST_CHECK_EQUAL(submit_rich_parent.m_state.GetRejectReason(), "transaction failed");

            auto it_parent = submit_rich_parent.m_tx_results.find(tx_parent_rich->GetWitnessHash());
            auto it_child = submit_rich_parent.m_tx_results.find(tx_child_poor->GetWitnessHash());
            BOOST_CHECK(it_parent->second.m_result_type == MempoolAcceptResult::ResultType::VALID);
            BOOST_CHECK(it_child->second.m_result_type == MempoolAcceptResult::ResultType::INVALID);
            BOOST_CHECK(it_parent->second.m_state.GetRejectReason() == "");
            BOOST_CHECK_MESSAGE(it_parent->second.m_base_fees.value() == high_parent_fee,
                    strprintf("rich parent: expected fee %s, got %s", high_parent_fee, it_parent->second.m_base_fees.value()));
            BOOST_CHECK(it_parent->second.m_effective_feerate == CFeeRate(high_parent_fee, GetVirtualTransactionSize(*tx_parent_rich)));
            BOOST_CHECK_EQUAL(it_child->second.m_result_type, MempoolAcceptResult::ResultType::INVALID);
            BOOST_CHECK_EQUAL(it_child->second.m_state.GetResult(), TxValidationResult::TX_MEMPOOL_POLICY);
            BOOST_CHECK(it_child->second.m_state.GetRejectReason() == "min relay fee not met");
        }
        expected_pool_size += 1;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }
}